

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

ArchKind __thiscall llvm::AArch64::getCPUArchKind(AArch64 *this,StringRef CPU)

{
  bool bVar1;
  ArchKind *pAVar2;
  bool local_1039;
  StringLiteral local_1028;
  StringLiteral local_1018;
  StringLiteral local_1008;
  StringLiteral local_ff8;
  StringLiteral local_fe8;
  StringLiteral local_fd8;
  StringLiteral local_fc8;
  StringLiteral local_fb8;
  StringLiteral local_fa8;
  StringLiteral local_f98;
  StringLiteral local_f88;
  StringLiteral local_f78;
  StringLiteral local_f68;
  StringLiteral local_f58;
  StringLiteral local_f48;
  StringLiteral local_f38;
  StringLiteral local_f28;
  StringLiteral local_f18;
  StringLiteral local_f08;
  StringLiteral local_ef8;
  StringLiteral local_ee8;
  AArch64 *local_ed8;
  char *local_ed0;
  AArch64 *local_ec8;
  char *local_ec0;
  Optional<llvm::AArch64::ArchKind> OStack_eb8;
  char *local_eb0 [2];
  AArch64 *local_ea0;
  char *local_e98;
  AArch64 *local_e90;
  StringRef CPU_local;
  AArch64 *local_e58;
  char *local_e50;
  char *local_e48;
  char **local_e40;
  AArch64 **local_e38;
  AArch64 *local_e30;
  char *local_e28;
  char *local_e20;
  char *local_e18;
  AArch64 *local_e10;
  char *local_e08;
  ArchKind local_dfc;
  AArch64 **local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  AArch64 *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  AArch64 *local_da0;
  char *local_d98;
  ArchKind local_d8c;
  AArch64 **local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  AArch64 *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  AArch64 *local_d30;
  char *local_d28;
  ArchKind local_d1c;
  AArch64 **local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  AArch64 *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  AArch64 *local_cc0;
  char *local_cb8;
  ArchKind local_cac;
  AArch64 **local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  AArch64 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  AArch64 *local_c50;
  char *local_c48;
  ArchKind local_c3c;
  AArch64 **local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  AArch64 *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  AArch64 *local_be0;
  char *local_bd8;
  ArchKind local_bcc;
  AArch64 **local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  AArch64 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  AArch64 *local_b70;
  char *local_b68;
  ArchKind local_b5c;
  AArch64 **local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  AArch64 *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  AArch64 *local_b00;
  char *local_af8;
  ArchKind local_aec;
  AArch64 **local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  AArch64 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  AArch64 *local_a90;
  char *local_a88;
  ArchKind local_a7c;
  AArch64 **local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  AArch64 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  AArch64 *local_a20;
  char *local_a18;
  ArchKind local_a0c;
  AArch64 **local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  AArch64 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  AArch64 *local_9b0;
  char *local_9a8;
  ArchKind local_99c;
  AArch64 **local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  AArch64 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  AArch64 *local_940;
  char *local_938;
  ArchKind local_92c;
  AArch64 **local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  AArch64 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  AArch64 *local_8d0;
  char *local_8c8;
  ArchKind local_8bc;
  AArch64 **local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  AArch64 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  AArch64 *local_860;
  char *local_858;
  ArchKind local_84c;
  AArch64 **local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  AArch64 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  AArch64 *local_7f0;
  char *local_7e8;
  ArchKind local_7dc;
  AArch64 **local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  AArch64 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  AArch64 *local_780;
  char *local_778;
  ArchKind local_76c;
  AArch64 **local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  AArch64 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  AArch64 *local_710;
  char *local_708;
  ArchKind local_6fc;
  AArch64 **local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  AArch64 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  AArch64 *local_6a0;
  char *local_698;
  ArchKind local_68c;
  AArch64 **local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  AArch64 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  AArch64 *local_630;
  char *local_628;
  ArchKind local_61c;
  AArch64 **local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  AArch64 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  AArch64 *local_5c0;
  char *local_5b8;
  ArchKind local_5ac;
  AArch64 **local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  AArch64 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  AArch64 *local_550;
  char *local_548;
  ArchKind local_53c;
  AArch64 **local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  AArch64 *local_500;
  char *local_4f8;
  ArchKind local_4ec;
  AArch64 **local_4e8;
  ArchKind local_4dc;
  AArch64 **local_4d8;
  char *local_4d0;
  char *local_4c8;
  AArch64 **local_4c0;
  char *local_4b8;
  char *local_4b0;
  AArch64 **local_4a8;
  char *local_4a0;
  char *local_498;
  AArch64 **local_490;
  char *local_488;
  char *local_480;
  AArch64 **local_478;
  char *local_470;
  char *local_468;
  AArch64 **local_460;
  char *local_458;
  char *local_450;
  AArch64 **local_448;
  char *local_440;
  char *local_438;
  AArch64 **local_430;
  char *local_428;
  char *local_420;
  AArch64 **local_418;
  char *local_410;
  char *local_408;
  AArch64 **local_400;
  char *local_3f8;
  char *local_3f0;
  AArch64 **local_3e8;
  char *local_3e0;
  char *local_3d8;
  AArch64 **local_3d0;
  char *local_3c8;
  char *local_3c0;
  AArch64 **local_3b8;
  char *local_3b0;
  char *local_3a8;
  AArch64 **local_3a0;
  char *local_398;
  char *local_390;
  AArch64 **local_388;
  char *local_380;
  char *local_378;
  AArch64 **local_370;
  char *local_368;
  char *local_360;
  AArch64 **local_358;
  char *local_350;
  char *local_348;
  AArch64 **local_340;
  char *local_338;
  char *local_330;
  AArch64 **local_328;
  char *local_320;
  char *local_318;
  AArch64 **local_310;
  char *local_308;
  char *local_300;
  AArch64 **local_2f8;
  char *local_2f0;
  char *local_2e8;
  AArch64 **local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  AArch64 *local_2b8;
  int local_2ac;
  char *local_2a8;
  char *local_2a0;
  AArch64 *local_298;
  int local_28c;
  char *local_288;
  char *local_280;
  AArch64 *local_278;
  int local_26c;
  char *local_268;
  char *local_260;
  AArch64 *local_258;
  int local_24c;
  char *local_248;
  char *local_240;
  AArch64 *local_238;
  int local_22c;
  char *local_228;
  char *local_220;
  AArch64 *local_218;
  int local_20c;
  char *local_208;
  char *local_200;
  AArch64 *local_1f8;
  int local_1ec;
  char *local_1e8;
  char *local_1e0;
  AArch64 *local_1d8;
  int local_1cc;
  char *local_1c8;
  char *local_1c0;
  AArch64 *local_1b8;
  int local_1ac;
  char *local_1a8;
  char *local_1a0;
  AArch64 *local_198;
  int local_18c;
  char *local_188;
  char *local_180;
  AArch64 *local_178;
  int local_16c;
  char *local_168;
  char *local_160;
  AArch64 *local_158;
  int local_14c;
  char *local_148;
  char *local_140;
  AArch64 *local_138;
  int local_12c;
  char *local_128;
  char *local_120;
  AArch64 *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  AArch64 *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  AArch64 *local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  AArch64 *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  AArch64 *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  AArch64 *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  AArch64 *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  AArch64 *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  AArch64 *local_18;
  int local_c;
  
  local_e98 = CPU.Data;
  local_e40 = local_eb0;
  local_e48 = "generic";
  local_eb0[0] = "generic";
  local_ea0 = this;
  local_e90 = this;
  CPU_local.Data = local_e98;
  local_2d0 = (char *)strlen("generic");
  local_e58 = local_ea0;
  local_e50 = local_e98;
  local_2d8 = local_eb0[0];
  local_2e0 = &local_e58;
  local_1039 = false;
  if (local_e98 == local_2d0) {
    local_2b8 = local_ea0;
    local_2c0 = local_eb0[0];
    local_2c8 = local_2d0;
    if (local_2d0 == (char *)0x0) {
      local_2ac = 0;
    }
    else {
      local_2ac = memcmp(local_ea0,local_eb0[0],(size_t)local_2d0);
    }
    local_1039 = local_2ac == 0;
  }
  if (local_1039) {
    CPU_local.Length._4_4_ = ARMV8A;
  }
  else {
    local_ed8 = local_e90;
    local_ed0 = CPU_local.Data;
    local_e30 = local_e90;
    local_e28 = CPU_local.Data;
    local_e38 = &local_ec8;
    local_ec8 = local_e90;
    local_ec0 = CPU_local.Data;
    Optional<llvm::AArch64::ArchKind>::Optional(&OStack_eb8);
    StringLiteral::StringLiteral<11UL>(&local_ee8,(char (*) [11])"cortex-a35");
    local_530 = local_ee8.super_StringRef.Data;
    local_528 = (char *)local_ee8.super_StringRef.Length;
    local_53c = ARMV8A;
    local_538 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_550 = local_ec8;
      local_548 = local_ec0;
      local_560 = local_530;
      local_558 = local_528;
      local_510 = local_530;
      local_508 = local_528;
      local_520 = local_530;
      local_518 = local_528;
      local_4d0 = local_530;
      local_4c8 = local_528;
      local_4d8 = &local_500;
      bVar1 = false;
      local_500 = local_550;
      local_4f8 = local_548;
      if (local_ec0 == local_528) {
        local_18 = local_ec8;
        local_20 = local_530;
        local_28 = local_528;
        if (local_528 == (char *)0x0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(local_ec8,local_530,(size_t)local_528);
        }
        bVar1 = local_c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_53c);
      }
    }
    StringLiteral::StringLiteral<11UL>(&local_ef8,(char (*) [11])"cortex-a53");
    local_5a0 = local_ef8.super_StringRef.Data;
    local_598 = (char *)local_ef8.super_StringRef.Length;
    local_5ac = ARMV8A;
    local_5a8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_5c0 = local_ec8;
      local_5b8 = local_ec0;
      local_5d0 = local_5a0;
      local_5c8 = local_598;
      local_580 = local_5a0;
      local_578 = local_598;
      local_590 = local_5a0;
      local_588 = local_598;
      local_4b8 = local_5a0;
      local_4b0 = local_598;
      local_4c0 = &local_570;
      bVar1 = false;
      local_570 = local_5c0;
      local_568 = local_5b8;
      if (local_ec0 == local_598) {
        local_38 = local_ec8;
        local_40 = local_5a0;
        local_48 = local_598;
        if (local_598 == (char *)0x0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp(local_ec8,local_5a0,(size_t)local_598);
        }
        bVar1 = local_2c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_5ac);
      }
    }
    StringLiteral::StringLiteral<11UL>(&local_f08,(char (*) [11])"cortex-a55");
    local_610 = local_f08.super_StringRef.Data;
    local_608 = (char *)local_f08.super_StringRef.Length;
    local_61c = ARMV8_2A;
    local_618 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_630 = local_ec8;
      local_628 = local_ec0;
      local_640 = local_610;
      local_638 = local_608;
      local_5f0 = local_610;
      local_5e8 = local_608;
      local_600 = local_610;
      local_5f8 = local_608;
      local_4a0 = local_610;
      local_498 = local_608;
      local_4a8 = &local_5e0;
      bVar1 = false;
      local_5e0 = local_630;
      local_5d8 = local_628;
      if (local_ec0 == local_608) {
        local_58 = local_ec8;
        local_60 = local_610;
        local_68 = local_608;
        if (local_608 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(local_ec8,local_610,(size_t)local_608);
        }
        bVar1 = local_4c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_61c);
      }
    }
    StringLiteral::StringLiteral<11UL>(&local_f18,(char (*) [11])"cortex-a57");
    local_680 = local_f18.super_StringRef.Data;
    local_678 = (char *)local_f18.super_StringRef.Length;
    local_68c = ARMV8A;
    local_688 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_6a0 = local_ec8;
      local_698 = local_ec0;
      local_6b0 = local_680;
      local_6a8 = local_678;
      local_660 = local_680;
      local_658 = local_678;
      local_670 = local_680;
      local_668 = local_678;
      local_488 = local_680;
      local_480 = local_678;
      local_490 = &local_650;
      bVar1 = false;
      local_650 = local_6a0;
      local_648 = local_698;
      if (local_ec0 == local_678) {
        local_78 = local_ec8;
        local_80 = local_680;
        local_88 = local_678;
        if (local_678 == (char *)0x0) {
          local_6c = 0;
        }
        else {
          local_6c = memcmp(local_ec8,local_680,(size_t)local_678);
        }
        bVar1 = local_6c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_68c);
      }
    }
    StringLiteral::StringLiteral<11UL>(&local_f28,(char (*) [11])"cortex-a72");
    local_6f0 = local_f28.super_StringRef.Data;
    local_6e8 = (char *)local_f28.super_StringRef.Length;
    local_6fc = ARMV8A;
    local_6f8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_710 = local_ec8;
      local_708 = local_ec0;
      local_720 = local_6f0;
      local_718 = local_6e8;
      local_6d0 = local_6f0;
      local_6c8 = local_6e8;
      local_6e0 = local_6f0;
      local_6d8 = local_6e8;
      local_470 = local_6f0;
      local_468 = local_6e8;
      local_478 = &local_6c0;
      bVar1 = false;
      local_6c0 = local_710;
      local_6b8 = local_708;
      if (local_ec0 == local_6e8) {
        local_98 = local_ec8;
        local_a0 = local_6f0;
        local_a8 = local_6e8;
        if (local_6e8 == (char *)0x0) {
          local_8c = 0;
        }
        else {
          local_8c = memcmp(local_ec8,local_6f0,(size_t)local_6e8);
        }
        bVar1 = local_8c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_6fc);
      }
    }
    StringLiteral::StringLiteral<11UL>(&local_f38,(char (*) [11])"cortex-a73");
    local_760 = local_f38.super_StringRef.Data;
    local_758 = (char *)local_f38.super_StringRef.Length;
    local_76c = ARMV8A;
    local_768 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_780 = local_ec8;
      local_778 = local_ec0;
      local_790 = local_760;
      local_788 = local_758;
      local_740 = local_760;
      local_738 = local_758;
      local_750 = local_760;
      local_748 = local_758;
      local_458 = local_760;
      local_450 = local_758;
      local_460 = &local_730;
      bVar1 = false;
      local_730 = local_780;
      local_728 = local_778;
      if (local_ec0 == local_758) {
        local_b8 = local_ec8;
        local_c0 = local_760;
        local_c8 = local_758;
        if (local_758 == (char *)0x0) {
          local_ac = 0;
        }
        else {
          local_ac = memcmp(local_ec8,local_760,(size_t)local_758);
        }
        bVar1 = local_ac == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_76c);
      }
    }
    StringLiteral::StringLiteral<11UL>(&local_f48,(char (*) [11])"cortex-a75");
    local_7d0 = local_f48.super_StringRef.Data;
    local_7c8 = (char *)local_f48.super_StringRef.Length;
    local_7dc = ARMV8_2A;
    local_7d8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_7f0 = local_ec8;
      local_7e8 = local_ec0;
      local_800 = local_7d0;
      local_7f8 = local_7c8;
      local_7b0 = local_7d0;
      local_7a8 = local_7c8;
      local_7c0 = local_7d0;
      local_7b8 = local_7c8;
      local_440 = local_7d0;
      local_438 = local_7c8;
      local_448 = &local_7a0;
      bVar1 = false;
      local_7a0 = local_7f0;
      local_798 = local_7e8;
      if (local_ec0 == local_7c8) {
        local_d8 = local_ec8;
        local_e0 = local_7d0;
        local_e8 = local_7c8;
        if (local_7c8 == (char *)0x0) {
          local_cc = 0;
        }
        else {
          local_cc = memcmp(local_ec8,local_7d0,(size_t)local_7c8);
        }
        bVar1 = local_cc == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_7dc);
      }
    }
    StringLiteral::StringLiteral<8UL>(&local_f58,(char (*) [8])"cyclone");
    local_840 = local_f58.super_StringRef.Data;
    local_838 = (char *)local_f58.super_StringRef.Length;
    local_84c = ARMV8A;
    local_848 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_860 = local_ec8;
      local_858 = local_ec0;
      local_870 = local_840;
      local_868 = local_838;
      local_820 = local_840;
      local_818 = local_838;
      local_830 = local_840;
      local_828 = local_838;
      local_428 = local_840;
      local_420 = local_838;
      local_430 = &local_810;
      bVar1 = false;
      local_810 = local_860;
      local_808 = local_858;
      if (local_ec0 == local_838) {
        local_f8 = local_ec8;
        local_100 = local_840;
        local_108 = local_838;
        if (local_838 == (char *)0x0) {
          local_ec = 0;
        }
        else {
          local_ec = memcmp(local_ec8,local_840,(size_t)local_838);
        }
        bVar1 = local_ec == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_84c);
      }
    }
    StringLiteral::StringLiteral<10UL>(&local_f68,(char (*) [10])"exynos-m1");
    local_8b0 = local_f68.super_StringRef.Data;
    local_8a8 = (char *)local_f68.super_StringRef.Length;
    local_8bc = ARMV8A;
    local_8b8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_8d0 = local_ec8;
      local_8c8 = local_ec0;
      local_8e0 = local_8b0;
      local_8d8 = local_8a8;
      local_890 = local_8b0;
      local_888 = local_8a8;
      local_8a0 = local_8b0;
      local_898 = local_8a8;
      local_410 = local_8b0;
      local_408 = local_8a8;
      local_418 = &local_880;
      bVar1 = false;
      local_880 = local_8d0;
      local_878 = local_8c8;
      if (local_ec0 == local_8a8) {
        local_118 = local_ec8;
        local_120 = local_8b0;
        local_128 = local_8a8;
        if (local_8a8 == (char *)0x0) {
          local_10c = 0;
        }
        else {
          local_10c = memcmp(local_ec8,local_8b0,(size_t)local_8a8);
        }
        bVar1 = local_10c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_8bc);
      }
    }
    StringLiteral::StringLiteral<10UL>(&local_f78,(char (*) [10])"exynos-m2");
    local_920 = local_f78.super_StringRef.Data;
    local_918 = (char *)local_f78.super_StringRef.Length;
    local_92c = ARMV8A;
    local_928 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_940 = local_ec8;
      local_938 = local_ec0;
      local_950 = local_920;
      local_948 = local_918;
      local_900 = local_920;
      local_8f8 = local_918;
      local_910 = local_920;
      local_908 = local_918;
      local_3f8 = local_920;
      local_3f0 = local_918;
      local_400 = &local_8f0;
      bVar1 = false;
      local_8f0 = local_940;
      local_8e8 = local_938;
      if (local_ec0 == local_918) {
        local_138 = local_ec8;
        local_140 = local_920;
        local_148 = local_918;
        if (local_918 == (char *)0x0) {
          local_12c = 0;
        }
        else {
          local_12c = memcmp(local_ec8,local_920,(size_t)local_918);
        }
        bVar1 = local_12c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_92c);
      }
    }
    StringLiteral::StringLiteral<10UL>(&local_f88,(char (*) [10])"exynos-m3");
    local_990 = local_f88.super_StringRef.Data;
    local_988 = (char *)local_f88.super_StringRef.Length;
    local_99c = ARMV8A;
    local_998 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_9b0 = local_ec8;
      local_9a8 = local_ec0;
      local_9c0 = local_990;
      local_9b8 = local_988;
      local_970 = local_990;
      local_968 = local_988;
      local_980 = local_990;
      local_978 = local_988;
      local_3e0 = local_990;
      local_3d8 = local_988;
      local_3e8 = &local_960;
      bVar1 = false;
      local_960 = local_9b0;
      local_958 = local_9a8;
      if (local_ec0 == local_988) {
        local_158 = local_ec8;
        local_160 = local_990;
        local_168 = local_988;
        if (local_988 == (char *)0x0) {
          local_14c = 0;
        }
        else {
          local_14c = memcmp(local_ec8,local_990,(size_t)local_988);
        }
        bVar1 = local_14c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_99c);
      }
    }
    StringLiteral::StringLiteral<10UL>(&local_f98,(char (*) [10])"exynos-m4");
    local_a00 = local_f98.super_StringRef.Data;
    local_9f8 = (char *)local_f98.super_StringRef.Length;
    local_a0c = ARMV8A;
    local_a08 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_a20 = local_ec8;
      local_a18 = local_ec0;
      local_a30 = local_a00;
      local_a28 = local_9f8;
      local_9e0 = local_a00;
      local_9d8 = local_9f8;
      local_9f0 = local_a00;
      local_9e8 = local_9f8;
      local_3c8 = local_a00;
      local_3c0 = local_9f8;
      local_3d0 = &local_9d0;
      bVar1 = false;
      local_9d0 = local_a20;
      local_9c8 = local_a18;
      if (local_ec0 == local_9f8) {
        local_178 = local_ec8;
        local_180 = local_a00;
        local_188 = local_9f8;
        if (local_9f8 == (char *)0x0) {
          local_16c = 0;
        }
        else {
          local_16c = memcmp(local_ec8,local_a00,(size_t)local_9f8);
        }
        bVar1 = local_16c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_a0c);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_fa8,(char (*) [7])"falkor");
    local_a70 = local_fa8.super_StringRef.Data;
    local_a68 = (char *)local_fa8.super_StringRef.Length;
    local_a7c = ARMV8A;
    local_a78 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_a90 = local_ec8;
      local_a88 = local_ec0;
      local_aa0 = local_a70;
      local_a98 = local_a68;
      local_a50 = local_a70;
      local_a48 = local_a68;
      local_a60 = local_a70;
      local_a58 = local_a68;
      local_3b0 = local_a70;
      local_3a8 = local_a68;
      local_3b8 = &local_a40;
      bVar1 = false;
      local_a40 = local_a90;
      local_a38 = local_a88;
      if (local_ec0 == local_a68) {
        local_198 = local_ec8;
        local_1a0 = local_a70;
        local_1a8 = local_a68;
        if (local_a68 == (char *)0x0) {
          local_18c = 0;
        }
        else {
          local_18c = memcmp(local_ec8,local_a70,(size_t)local_a68);
        }
        bVar1 = local_18c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_a7c);
      }
    }
    StringLiteral::StringLiteral<8UL>(&local_fb8,(char (*) [8])"saphira");
    local_ae0 = local_fb8.super_StringRef.Data;
    local_ad8 = (char *)local_fb8.super_StringRef.Length;
    local_aec = ARMV8_3A;
    local_ae8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_b00 = local_ec8;
      local_af8 = local_ec0;
      local_b10 = local_ae0;
      local_b08 = local_ad8;
      local_ac0 = local_ae0;
      local_ab8 = local_ad8;
      local_ad0 = local_ae0;
      local_ac8 = local_ad8;
      local_398 = local_ae0;
      local_390 = local_ad8;
      local_3a0 = &local_ab0;
      bVar1 = false;
      local_ab0 = local_b00;
      local_aa8 = local_af8;
      if (local_ec0 == local_ad8) {
        local_1b8 = local_ec8;
        local_1c0 = local_ae0;
        local_1c8 = local_ad8;
        if (local_ad8 == (char *)0x0) {
          local_1ac = 0;
        }
        else {
          local_1ac = memcmp(local_ec8,local_ae0,(size_t)local_ad8);
        }
        bVar1 = local_1ac == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_aec);
      }
    }
    StringLiteral::StringLiteral<5UL>(&local_fc8,(char (*) [5])"kryo");
    local_b50 = local_fc8.super_StringRef.Data;
    local_b48 = (char *)local_fc8.super_StringRef.Length;
    local_b5c = ARMV8A;
    local_b58 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_b70 = local_ec8;
      local_b68 = local_ec0;
      local_b80 = local_b50;
      local_b78 = local_b48;
      local_b30 = local_b50;
      local_b28 = local_b48;
      local_b40 = local_b50;
      local_b38 = local_b48;
      local_380 = local_b50;
      local_378 = local_b48;
      local_388 = &local_b20;
      bVar1 = false;
      local_b20 = local_b70;
      local_b18 = local_b68;
      if (local_ec0 == local_b48) {
        local_1d8 = local_ec8;
        local_1e0 = local_b50;
        local_1e8 = local_b48;
        if (local_b48 == (char *)0x0) {
          local_1cc = 0;
        }
        else {
          local_1cc = memcmp(local_ec8,local_b50,(size_t)local_b48);
        }
        bVar1 = local_1cc == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_b5c);
      }
    }
    StringLiteral::StringLiteral<13UL>(&local_fd8,(char (*) [13])"thunderx2t99");
    local_bc0 = local_fd8.super_StringRef.Data;
    local_bb8 = (char *)local_fd8.super_StringRef.Length;
    local_bcc = ARMV8_1A;
    local_bc8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_be0 = local_ec8;
      local_bd8 = local_ec0;
      local_bf0 = local_bc0;
      local_be8 = local_bb8;
      local_ba0 = local_bc0;
      local_b98 = local_bb8;
      local_bb0 = local_bc0;
      local_ba8 = local_bb8;
      local_368 = local_bc0;
      local_360 = local_bb8;
      local_370 = &local_b90;
      bVar1 = false;
      local_b90 = local_be0;
      local_b88 = local_bd8;
      if (local_ec0 == local_bb8) {
        local_1f8 = local_ec8;
        local_200 = local_bc0;
        local_208 = local_bb8;
        if (local_bb8 == (char *)0x0) {
          local_1ec = 0;
        }
        else {
          local_1ec = memcmp(local_ec8,local_bc0,(size_t)local_bb8);
        }
        bVar1 = local_1ec == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_bcc);
      }
    }
    StringLiteral::StringLiteral<9UL>(&local_fe8,(char (*) [9])"thunderx");
    local_c30 = local_fe8.super_StringRef.Data;
    local_c28 = (char *)local_fe8.super_StringRef.Length;
    local_c3c = ARMV8A;
    local_c38 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_c50 = local_ec8;
      local_c48 = local_ec0;
      local_c60 = local_c30;
      local_c58 = local_c28;
      local_c10 = local_c30;
      local_c08 = local_c28;
      local_c20 = local_c30;
      local_c18 = local_c28;
      local_350 = local_c30;
      local_348 = local_c28;
      local_358 = &local_c00;
      bVar1 = false;
      local_c00 = local_c50;
      local_bf8 = local_c48;
      if (local_ec0 == local_c28) {
        local_218 = local_ec8;
        local_220 = local_c30;
        local_228 = local_c28;
        if (local_c28 == (char *)0x0) {
          local_20c = 0;
        }
        else {
          local_20c = memcmp(local_ec8,local_c30,(size_t)local_c28);
        }
        bVar1 = local_20c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_c3c);
      }
    }
    StringLiteral::StringLiteral<12UL>(&local_ff8,(char (*) [12])"thunderxt88");
    local_ca0 = local_ff8.super_StringRef.Data;
    local_c98 = (char *)local_ff8.super_StringRef.Length;
    local_cac = ARMV8A;
    local_ca8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_cc0 = local_ec8;
      local_cb8 = local_ec0;
      local_cd0 = local_ca0;
      local_cc8 = local_c98;
      local_c80 = local_ca0;
      local_c78 = local_c98;
      local_c90 = local_ca0;
      local_c88 = local_c98;
      local_338 = local_ca0;
      local_330 = local_c98;
      local_340 = &local_c70;
      bVar1 = false;
      local_c70 = local_cc0;
      local_c68 = local_cb8;
      if (local_ec0 == local_c98) {
        local_238 = local_ec8;
        local_240 = local_ca0;
        local_248 = local_c98;
        if (local_c98 == (char *)0x0) {
          local_22c = 0;
        }
        else {
          local_22c = memcmp(local_ec8,local_ca0,(size_t)local_c98);
        }
        bVar1 = local_22c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_cac);
      }
    }
    StringLiteral::StringLiteral<12UL>(&local_1008,(char (*) [12])"thunderxt81");
    local_d10 = local_1008.super_StringRef.Data;
    local_d08 = (char *)local_1008.super_StringRef.Length;
    local_d1c = ARMV8A;
    local_d18 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_d30 = local_ec8;
      local_d28 = local_ec0;
      local_d40 = local_d10;
      local_d38 = local_d08;
      local_cf0 = local_d10;
      local_ce8 = local_d08;
      local_d00 = local_d10;
      local_cf8 = local_d08;
      local_320 = local_d10;
      local_318 = local_d08;
      local_328 = &local_ce0;
      bVar1 = false;
      local_ce0 = local_d30;
      local_cd8 = local_d28;
      if (local_ec0 == local_d08) {
        local_258 = local_ec8;
        local_260 = local_d10;
        local_268 = local_d08;
        if (local_d08 == (char *)0x0) {
          local_24c = 0;
        }
        else {
          local_24c = memcmp(local_ec8,local_d10,(size_t)local_d08);
        }
        bVar1 = local_24c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_d1c);
      }
    }
    StringLiteral::StringLiteral<12UL>(&local_1018,(char (*) [12])"thunderxt83");
    local_d80 = local_1018.super_StringRef.Data;
    local_d78 = (char *)local_1018.super_StringRef.Length;
    local_d8c = ARMV8A;
    local_d88 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_da0 = local_ec8;
      local_d98 = local_ec0;
      local_db0 = local_d80;
      local_da8 = local_d78;
      local_d60 = local_d80;
      local_d58 = local_d78;
      local_d70 = local_d80;
      local_d68 = local_d78;
      local_308 = local_d80;
      local_300 = local_d78;
      local_310 = &local_d50;
      bVar1 = false;
      local_d50 = local_da0;
      local_d48 = local_d98;
      if (local_ec0 == local_d78) {
        local_278 = local_ec8;
        local_280 = local_d80;
        local_288 = local_d78;
        if (local_d78 == (char *)0x0) {
          local_26c = 0;
        }
        else {
          local_26c = memcmp(local_ec8,local_d80,(size_t)local_d78);
        }
        bVar1 = local_26c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_d8c);
      }
    }
    StringLiteral::StringLiteral<8UL>(&local_1028,(char (*) [8])"invalid");
    local_df0 = local_1028.super_StringRef.Data;
    local_de8 = (char *)local_1028.super_StringRef.Length;
    local_dfc = INVALID;
    local_df8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (!bVar1) {
      local_e10 = local_ec8;
      local_e08 = local_ec0;
      local_e20 = local_df0;
      local_e18 = local_de8;
      local_dd0 = local_df0;
      local_dc8 = local_de8;
      local_de0 = local_df0;
      local_dd8 = local_de8;
      local_2f0 = local_df0;
      local_2e8 = local_de8;
      local_2f8 = &local_dc0;
      bVar1 = false;
      local_dc0 = local_e10;
      local_db8 = local_e08;
      if (local_ec0 == local_de8) {
        local_298 = local_ec8;
        local_2a0 = local_df0;
        local_2a8 = local_de8;
        if (local_de8 == (char *)0x0) {
          local_28c = 0;
        }
        else {
          local_28c = memcmp(local_ec8,local_df0,(size_t)local_de8);
        }
        bVar1 = local_28c == 0;
      }
      if (bVar1) {
        Optional<llvm::AArch64::ArchKind>::operator=(&OStack_eb8,&local_dfc);
      }
    }
    local_4ec = INVALID;
    local_4e8 = &local_ec8;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_eb8);
    if (bVar1) {
      pAVar2 = Optional<llvm::AArch64::ArchKind>::operator*(&OStack_eb8);
      local_4dc = *pAVar2;
    }
    else {
      local_4dc = local_4ec;
    }
    CPU_local.Length._4_4_ = local_4dc;
  }
  return CPU_local.Length._4_4_;
}

Assistant:

AArch64::ArchKind llvm::AArch64::getCPUArchKind(StringRef CPU) {
  if (CPU == "generic")
    return AArch64::ArchKind::ARMV8A;

  return StringSwitch<AArch64::ArchKind>(CPU)
#define AARCH64_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT) \
  .Case(NAME, AArch64::ArchKind:: ID)
#include "llvm/Support/AArch64TargetParser.def"
    .Default(AArch64::ArchKind::INVALID);
}